

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_tables.cpp
# Opt level: O0

ImGuiTableSettings * ImGui::TableSettingsCreate(ImGuiID id,int columns_count)

{
  ImChunkStream<ImGuiTableSettings> *this;
  size_t sz;
  ImGuiTableSettings *settings_00;
  ImGuiTableSettings *settings;
  ImGuiContext *g;
  int columns_count_local;
  ImGuiID id_local;
  
  this = &GImGui->SettingsTables;
  sz = TableSettingsCalcChunkSize(columns_count);
  settings_00 = ImChunkStream<ImGuiTableSettings>::alloc_chunk(this,sz);
  TableSettingsInit(settings_00,id,columns_count,columns_count);
  return settings_00;
}

Assistant:

ImGuiTableSettings* ImGui::TableSettingsCreate(ImGuiID id, int columns_count)
{
    ImGuiContext& g = *GImGui;
    ImGuiTableSettings* settings = g.SettingsTables.alloc_chunk(TableSettingsCalcChunkSize(columns_count));
    TableSettingsInit(settings, id, columns_count, columns_count);
    return settings;
}